

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::SysStatsConfig::SysStatsConfig(SysStatsConfig *this,SysStatsConfig *param_1)

{
  uint32_t uVar1;
  SysStatsConfig *param_1_local;
  SysStatsConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__SysStatsConfig_009c1618;
  this->meminfo_period_ms_ = param_1->meminfo_period_ms_;
  std::
  vector<perfetto::protos::gen::MeminfoCounters,_std::allocator<perfetto::protos::gen::MeminfoCounters>_>
  ::vector(&this->meminfo_counters_,&param_1->meminfo_counters_);
  this->vmstat_period_ms_ = param_1->vmstat_period_ms_;
  std::
  vector<perfetto::protos::gen::VmstatCounters,_std::allocator<perfetto::protos::gen::VmstatCounters>_>
  ::vector(&this->vmstat_counters_,&param_1->vmstat_counters_);
  this->stat_period_ms_ = param_1->stat_period_ms_;
  std::
  vector<perfetto::protos::gen::SysStatsConfig_StatCounters,_std::allocator<perfetto::protos::gen::SysStatsConfig_StatCounters>_>
  ::vector(&this->stat_counters_,&param_1->stat_counters_);
  uVar1 = param_1->cpufreq_period_ms_;
  this->devfreq_period_ms_ = param_1->devfreq_period_ms_;
  this->cpufreq_period_ms_ = uVar1;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

SysStatsConfig::SysStatsConfig(SysStatsConfig&&) noexcept = default;